

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::log_message(ConsoleReporter *this,MessageData *mb)

{
  Enum at;
  Enum code;
  ostream *poVar1;
  char *pcVar2;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> DOCTEST_ANON_LOCK_11;
  MessageData *mb_local;
  ConsoleReporter *this_local;
  
  if ((this->tc->m_no_output & 1U) == 0) {
    DOCTEST_ANON_LOCK_11._M_device = (mutex_type *)mb;
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
    logTestStart(this);
    (*(this->super_IReporter)._vptr_IReporter[0xe])
              (this,((DOCTEST_ANON_LOCK_11._M_device)->super___mutex_base)._M_mutex.__data.__list.
                    __prev,
               (ulong)*(uint *)((long)&((DOCTEST_ANON_LOCK_11._M_device)->super___mutex_base).
                                       _M_mutex + 0x20)," ");
    poVar1 = this->s;
    code = getSuccessOrFailColor
                     (this,false,
                      *(Enum *)((long)&((DOCTEST_ANON_LOCK_11._M_device)->super___mutex_base).
                                       _M_mutex + 0x24));
    poVar1 = Color::operator<<(poVar1,code);
    at = *(Enum *)((long)&((DOCTEST_ANON_LOCK_11._M_device)->super___mutex_base)._M_mutex + 0x24);
    pcVar2 = getSuccessOrFailString(this,(bool)((byte)at & 1),at,"MESSAGE");
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,": ");
    poVar1 = Color::operator<<(this->s,None);
    poVar1 = doctest::operator<<(poVar1,(String *)DOCTEST_ANON_LOCK_11._M_device);
    std::operator<<(poVar1,"\n");
    log_contexts(this);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
  }
  return;
}

Assistant:

void log_message(const MessageData& mb) override {
            if(tc->m_no_output)
                return;

            DOCTEST_LOCK_MUTEX(mutex)

            logTestStart();

            file_line_to_stream(mb.m_file, mb.m_line, " ");
            s << getSuccessOrFailColor(false, mb.m_severity)
              << getSuccessOrFailString(mb.m_severity & assertType::is_warn, mb.m_severity,
                                        "MESSAGE") << ": ";
            s << Color::None << mb.m_string << "\n";
            log_contexts();
        }